

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::dart::DartGenerator::GenerateStructs
          (DartGenerator *this,namespace_code_map *namespace_code)

{
  bool bVar1;
  reference ppSVar2;
  StructDef *struct_def;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_20;
  const_iterator it;
  namespace_code_map *namespace_code_local;
  DartGenerator *this_local;
  
  it._M_current = (StructDef **)namespace_code;
  local_20._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->structs_).vec);
  while( true ) {
    struct_def = (StructDef *)
                 std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 end(&(((this->super_BaseGenerator).parser_)->structs_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)&struct_def);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_20);
    GenStruct(this,*ppSVar2,(namespace_code_map *)it._M_current);
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void GenerateStructs(namespace_code_map &namespace_code) {
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      GenStruct(struct_def, namespace_code);
    }
  }